

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O0

void __thiscall tst_RoleMaskProxyModel::testUseRoleMask(tst_RoleMaskProxyModel *this)

{
  byte bVar1;
  undefined8 uVar2;
  qsizetype qVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  long *plVar7;
  QList<QModelIndex> *pQVar8;
  byte *pbVar9;
  ModelTest *this_00;
  QModelIndex local_120;
  QModelIndex local_108;
  QVariant local_f0;
  undefined4 local_cc;
  QVariant local_c8;
  undefined1 local_a8 [32];
  QModelIndex *singleIdx;
  iterator local_80;
  iterator __end1;
  iterator __begin1;
  QModelIndexList *__range1;
  undefined1 local_60 [4];
  int magicNumber;
  RoleMaskProxyModel proxyModel;
  undefined1 local_30 [7];
  bool userRoleEditable;
  QModelIndexList magicNumerIndexes;
  QAbstractItemModel *baseModel;
  tst_RoleMaskProxyModel *this_local;
  
  iVar6 = qMetaTypeId<QAbstractItemModel*>();
  plVar7 = (long *)QTest::qData("baseModel",iVar6);
  magicNumerIndexes.d.size = *plVar7;
  if (magicNumerIndexes.d.size != 0) {
    iVar6 = qMetaTypeId<QList<QModelIndex>>();
    pQVar8 = (QList<QModelIndex> *)QTest::qData("magicNumerIndexes",iVar6);
    QList<QModelIndex>::QList((QList<QModelIndex> *)local_30,pQVar8);
    iVar6 = qMetaTypeId<bool>();
    pbVar9 = (byte *)QTest::qData("userRoleEditable",iVar6);
    bVar1 = *pbVar9;
    RoleMaskProxyModel::RoleMaskProxyModel((RoleMaskProxyModel *)local_60,(QObject *)0x0);
    this_00 = (ModelTest *)operator_new(0x10);
    ModelTest::ModelTest(this_00,(QAbstractItemModel *)local_60,(QObject *)magicNumerIndexes.d.size)
    ;
    RoleMaskProxyModel::addMaskedRole((int)local_60);
    RoleMaskProxyModel::setSourceModel((QAbstractItemModel *)local_60);
    __end1 = QList<QModelIndex>::begin((QList<QModelIndex> *)local_30);
    local_80 = QList<QModelIndex>::end((QList<QModelIndex> *)local_30);
    while( true ) {
      singleIdx = local_80.i;
      bVar4 = QList<QModelIndex>::iterator::operator!=(&__end1,local_80);
      qVar3 = magicNumerIndexes.d.size;
      if (!bVar4) break;
      local_a8._24_8_ = QList<QModelIndex>::iterator::operator*(&__end1);
      QIdentityProxyModel::mapFromSource((QModelIndex *)local_a8);
      QVariant::QVariant(&local_c8,0xbfdd2);
      bVar5 = RoleMaskProxyModel::setData
                        ((QModelIndex *)local_60,(QVariant *)local_a8,(int)&local_c8);
      bVar5 = QTest::qVerify((bool)(bVar5 & 1),
                             "proxyModel.setData(proxyModel.mapFromSource(singleIdx), magicNumber, Qt::UserRole)"
                             ,"",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                             ,0x89);
      QVariant::~QVariant(&local_c8);
      qVar3 = magicNumerIndexes.d.size;
      uVar2 = local_a8._24_8_;
      if (((bVar5 ^ 0xff) & 1) != 0) {
        local_cc = 1;
        goto LAB_0010bcf7;
      }
      QVariant::QVariant(&local_f0,-0xbfdd3);
      bVar5 = (**(code **)(*(long *)qVar3 + 0x98))(qVar3,uVar2,&local_f0,0x100);
      bVar5 = QTest::qVerify((bVar1 & 1) == (bVar5 & 1),
                             "userRoleEditable == baseModel->setData(singleIdx, ~magicNumber, Qt::UserRole)"
                             ,"",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                             ,0x8a);
      QVariant::~QVariant(&local_f0);
      if (((bVar5 ^ 0xff) & 1) != 0) {
        local_cc = 1;
        goto LAB_0010bcf7;
      }
      QList<QModelIndex>::iterator::operator++(&__end1);
    }
    QModelIndex::QModelIndex(&local_108);
    QModelIndex::QModelIndex(&local_120);
    testUseRoleMaskRecurse
              (this,0xbfdd2,(QAbstractItemModel *)qVar3,(RoleMaskProxyModel *)local_60,
               (QModelIndexList *)local_30,(bool)(bVar1 & 1),&local_108,&local_120);
    QObject::deleteLater();
    local_cc = 0;
LAB_0010bcf7:
    RoleMaskProxyModel::~RoleMaskProxyModel((RoleMaskProxyModel *)local_60);
    QList<QModelIndex>::~QList((QList<QModelIndex> *)local_30);
  }
  return;
}

Assistant:

void tst_RoleMaskProxyModel::testUseRoleMask()
{
    QFETCH(QAbstractItemModel *, baseModel);
    if (!baseModel)
        return;
    QFETCH(QModelIndexList, magicNumerIndexes);
    QFETCH(bool, userRoleEditable);
    RoleMaskProxyModel proxyModel;
    new ModelTest(&proxyModel, baseModel);
    proxyModel.addMaskedRole(Qt::UserRole);
    proxyModel.setSourceModel(baseModel);
    const int magicNumber = 785874;
    for (const QModelIndex &singleIdx : magicNumerIndexes) {
        QVERIFY(proxyModel.setData(proxyModel.mapFromSource(singleIdx), magicNumber, Qt::UserRole));
        QVERIFY(userRoleEditable == baseModel->setData(singleIdx, ~magicNumber, Qt::UserRole));
    }
    testUseRoleMaskRecurse(magicNumber, baseModel, &proxyModel, magicNumerIndexes, userRoleEditable);
    baseModel->deleteLater();
}